

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perfetto.cc
# Opt level: O1

void __thiscall
perfetto::protos::gen::ChromeKeyedService::ChromeKeyedService
          (ChromeKeyedService *this,ChromeKeyedService *param_1)

{
  pointer pcVar1;
  
  (this->super_CppMessageObj)._vptr_CppMessageObj = (_func_int **)&PTR__ChromeKeyedService_003c8038;
  (this->name_)._M_dataplus._M_p = (pointer)&(this->name_).field_2;
  pcVar1 = (param_1->name_)._M_dataplus._M_p;
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)&this->name_,pcVar1,pcVar1 + (param_1->name_)._M_string_length);
  (this->unknown_fields_)._M_dataplus._M_p = (pointer)&(this->unknown_fields_).field_2;
  pcVar1 = (param_1->unknown_fields_)._M_dataplus._M_p;
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)&this->unknown_fields_,pcVar1,
             pcVar1 + (param_1->unknown_fields_)._M_string_length);
  (this->_has_field_).super__Base_bitset<1UL>._M_w =
       (param_1->_has_field_).super__Base_bitset<1UL>._M_w;
  return;
}

Assistant:

ChromeKeyedService::ChromeKeyedService(const ChromeKeyedService&) = default;